

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionControlElementType::~IfcDistributionControlElementType
          (IfcDistributionControlElementType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject = 0x8a2fc8;
  *(undefined8 *)&(this->super_IfcDistributionElementType).field_0x1a0 = 0x8a3090;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0x88 = 0x8a2ff0;
  (this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
  super_IfcTypeObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8a3018;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
    super_IfcTypeObject.field_0xf0 = 0x8a3040;
  *(undefined8 *)
   &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8a3068;
  puVar1 = *(undefined1 **)
            &(this->super_IfcDistributionElementType).super_IfcElementType.super_IfcTypeProduct.
             field_0x158;
  if (puVar1 != &(this->super_IfcDistributionElementType).super_IfcElementType.field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008a2d28);
  operator_delete(this);
  return;
}

Assistant:

IfcDistributionControlElementType() : Object("IfcDistributionControlElementType") {}